

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void TestParseArray(void)

{
  FILE *pFVar1;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> pBVar2;
  ValueTypes VVar3;
  int iVar4;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> *ppBVar5;
  __tuple_element_t<0UL,_tuple<ParseResults,_BubbleValue_*>_> *p_Var6;
  size_t sVar7;
  BubbleValue *pBVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  long lVar12;
  BubbleValue *this;
  double dVar13;
  double dVar14;
  BubbleValue *valueLevel3;
  int j_1;
  BubbleValue *valueLevel2;
  undefined1 local_68 [4];
  int i_1;
  uint local_58;
  uint local_54;
  int j;
  int i;
  BubbleJson local_40;
  BubbleJson local_30;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> local_20;
  BubbleValue *value;
  tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> result;
  
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::tuple<true,_true>
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  bubbleJson::BubbleJson::Parse(&local_30,(char *)&gm_BubbleJson);
  pcVar9 = (char *)&local_30;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value,(type)pcVar9);
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  local_20 = *ppBVar5;
  g_TestCount = g_TestCount + 1;
  p_Var6 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  pFVar1 = _stderr;
  if (*p_Var6 == ParseResult_Ok) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var6 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
    pcVar9 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x108,0,(ulong)*p_Var6);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  VVar3 = bubbleJson::BubbleValue::GetType(local_20);
  pFVar1 = _stderr;
  if (VVar3 == ValueType_Array) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    VVar3 = bubbleJson::BubbleValue::GetType(local_20);
    pcVar9 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x109,5,(ulong)VVar3);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  sVar7 = bubbleJson::BubbleValue::GetArrayCount(local_20);
  pFVar1 = _stderr;
  if (sVar7 == 0) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    sVar7 = bubbleJson::BubbleValue::GetArrayCount(local_20);
    pcVar9 = "%s:%d: expect: %zu actual: %zu\n";
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x10a,0,sVar7);
    g_Result = 1;
  }
  pBVar2 = local_20;
  if (local_20 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(local_20);
    bubbleJson::BubbleValue::operator_delete(pBVar2,pcVar9);
  }
  bubbleJson::BubbleJson::Parse(&local_40,(char *)&gm_BubbleJson);
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value,(type)&local_40);
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  local_20 = *ppBVar5;
  g_TestCount = g_TestCount + 1;
  p_Var6 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  pFVar1 = _stderr;
  if (*p_Var6 == ParseResult_Ok) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var6 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x10f,0,(ulong)*p_Var6);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  VVar3 = bubbleJson::BubbleValue::GetType(local_20);
  pFVar1 = _stderr;
  if (VVar3 == ValueType_Array) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    VVar3 = bubbleJson::BubbleValue::GetType(local_20);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x110,5,(ulong)VVar3);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  sVar7 = bubbleJson::BubbleValue::GetArrayCount(local_20);
  pFVar1 = _stderr;
  if (sVar7 == 5) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    sVar7 = bubbleJson::BubbleValue::GetArrayCount(local_20);
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x111,5,sVar7);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar8 = bubbleJson::BubbleValue::operator[](local_20,0);
  VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
  pFVar1 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar8 = bubbleJson::BubbleValue::operator[](local_20,0);
    VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x113,0,(ulong)VVar3);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar8 = bubbleJson::BubbleValue::operator[](local_20,1);
  VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
  pFVar1 = _stderr;
  if (VVar3 == ValueType_False) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar8 = bubbleJson::BubbleValue::operator[](local_20,1);
    VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x114,1,(ulong)VVar3);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar8 = bubbleJson::BubbleValue::operator[](local_20,2);
  VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
  pFVar1 = _stderr;
  if (VVar3 == ValueType_True) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar8 = bubbleJson::BubbleValue::operator[](local_20,2);
    VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x115,2,(ulong)VVar3);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar8 = bubbleJson::BubbleValue::operator[](local_20,3);
  VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
  pFVar1 = _stderr;
  if (VVar3 == ValueType_Number) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar8 = bubbleJson::BubbleValue::operator[](local_20,3);
    VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x116,3,(ulong)VVar3);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar8 = bubbleJson::BubbleValue::operator[](local_20,4);
  VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
  pFVar1 = _stderr;
  if (VVar3 == ValueType_String) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar8 = bubbleJson::BubbleValue::operator[](local_20,4);
    VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x117,4,(ulong)VVar3);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar8 = bubbleJson::BubbleValue::operator[](local_20,3);
  dVar13 = bubbleJson::BubbleValue::GetNumber(pBVar8);
  pFVar1 = _stderr;
  if ((dVar13 != 123.0) || (NAN(dVar13))) {
    pBVar8 = bubbleJson::BubbleValue::operator[](local_20,3);
    dVar13 = bubbleJson::BubbleValue::GetNumber(pBVar8);
    fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",0x405ec00000000000,SUB84(dVar13,0),
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x119);
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar8 = bubbleJson::BubbleValue::operator[](local_20,4);
  sVar7 = bubbleJson::BubbleValue::GetStringLength(pBVar8);
  if (sVar7 == 3) {
    pBVar8 = bubbleJson::BubbleValue::operator[](local_20,4);
    pcVar9 = bubbleJson::BubbleValue::GetString(pBVar8);
    pBVar8 = bubbleJson::BubbleValue::operator[](local_20,4);
    sVar7 = bubbleJson::BubbleValue::GetStringLength(pBVar8);
    iVar4 = memcmp("abc",pcVar9,sVar7);
    if (iVar4 == 0) {
      g_TestPass = g_TestPass + 1;
      goto LAB_00116568;
    }
  }
  pFVar1 = _stderr;
  pBVar8 = bubbleJson::BubbleValue::operator[](local_20,4);
  pcVar10 = bubbleJson::BubbleValue::GetString(pBVar8);
  pcVar9 = "%s:%d: expect: %s actual: %s\n";
  fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0x11a,
          "abc",pcVar10);
  g_Result = 1;
LAB_00116568:
  pBVar2 = local_20;
  if (local_20 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(local_20);
    bubbleJson::BubbleValue::operator_delete(pBVar2,pcVar9);
  }
  bubbleJson::BubbleJson::Parse((BubbleJson *)&j,(char *)&gm_BubbleJson);
  pcVar9 = (char *)&j;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value,(type)pcVar9);
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  local_20 = *ppBVar5;
  g_TestCount = g_TestCount + 1;
  p_Var6 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  pFVar1 = _stderr;
  if (*p_Var6 == ParseResult_Ok) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var6 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
    pcVar9 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x120,0,(ulong)*p_Var6);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  VVar3 = bubbleJson::BubbleValue::GetType(local_20);
  pFVar1 = _stderr;
  if (VVar3 == ValueType_Array) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    VVar3 = bubbleJson::BubbleValue::GetType(local_20);
    pcVar9 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x121,5,(ulong)VVar3);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  sVar7 = bubbleJson::BubbleValue::GetArrayCount(local_20);
  pFVar1 = _stderr;
  if (sVar7 == 4) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    sVar7 = bubbleJson::BubbleValue::GetArrayCount(local_20);
    pcVar9 = "%s:%d: expect: %zu actual: %zu\n";
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x122,4,sVar7);
    g_Result = 1;
  }
  for (local_54 = 0; pBVar2 = local_20, (int)local_54 < 4; local_54 = local_54 + 1) {
    g_TestCount = g_TestCount + 1;
    pBVar8 = bubbleJson::BubbleValue::operator[](local_20,local_54);
    VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
    pFVar1 = _stderr;
    if (VVar3 == ValueType_Array) {
      g_TestPass = g_TestPass + 1;
    }
    else {
      pBVar8 = bubbleJson::BubbleValue::operator[](local_20,local_54);
      VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
      fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x125,5,(ulong)VVar3);
      g_Result = 1;
    }
    g_TestCount = g_TestCount + 1;
    sVar7 = (size_t)(int)local_54;
    pcVar9 = (char *)(ulong)local_54;
    pBVar8 = bubbleJson::BubbleValue::operator[](local_20,local_54);
    sVar11 = bubbleJson::BubbleValue::GetArrayCount(pBVar8);
    pFVar1 = _stderr;
    if (sVar7 == sVar11) {
      g_TestPass = g_TestPass + 1;
    }
    else {
      lVar12 = (long)(int)local_54;
      pBVar8 = bubbleJson::BubbleValue::operator[](local_20,local_54);
      sVar7 = bubbleJson::BubbleValue::GetArrayCount(pBVar8);
      pcVar9 = "%s:%d: expect: %zu actual: %zu\n";
      fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x126,lVar12,sVar7);
      g_Result = 1;
    }
    for (local_58 = 0; (int)local_58 < (int)local_54; local_58 = local_58 + 1) {
      g_TestCount = g_TestCount + 1;
      pBVar8 = bubbleJson::BubbleValue::operator[](local_20,local_54);
      pBVar8 = bubbleJson::BubbleValue::operator[](pBVar8,local_58);
      VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
      pFVar1 = _stderr;
      if (VVar3 == ValueType_Number) {
        g_TestPass = g_TestPass + 1;
      }
      else {
        pBVar8 = bubbleJson::BubbleValue::operator[](local_20,local_54);
        pBVar8 = bubbleJson::BubbleValue::operator[](pBVar8,local_58);
        VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
        fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
                0x129,3,(ulong)VVar3);
        g_Result = 1;
      }
      g_TestCount = g_TestCount + 1;
      dVar13 = (double)(int)local_58;
      pBVar8 = bubbleJson::BubbleValue::operator[](local_20,local_54);
      pcVar9 = (char *)(ulong)local_58;
      pBVar8 = bubbleJson::BubbleValue::operator[](pBVar8,local_58);
      dVar14 = bubbleJson::BubbleValue::GetNumber(pBVar8);
      pFVar1 = _stderr;
      if ((dVar13 != dVar14) || (NAN(dVar13) || NAN(dVar14))) {
        dVar13 = (double)(int)local_58;
        pBVar8 = bubbleJson::BubbleValue::operator[](local_20,local_54);
        pBVar8 = bubbleJson::BubbleValue::operator[](pBVar8,local_58);
        dVar14 = bubbleJson::BubbleValue::GetNumber(pBVar8);
        pcVar9 = "%s:%d: expect: %.17g actual: %.17g\n";
        fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",dVar13,SUB84(dVar14,0),
                "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
                0x12a);
        g_Result = 1;
      }
      else {
        g_TestPass = g_TestPass + 1;
      }
    }
  }
  if (local_20 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(local_20);
    bubbleJson::BubbleValue::operator_delete(pBVar2,pcVar9);
  }
  bubbleJson::BubbleJson::Parse((BubbleJson *)local_68,(char *)&gm_BubbleJson);
  pcVar9 = local_68;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value,(type)pcVar9);
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  local_20 = *ppBVar5;
  g_TestCount = g_TestCount + 1;
  p_Var6 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  pFVar1 = _stderr;
  if (*p_Var6 == ParseResult_Ok) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var6 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
    pcVar9 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x132,0,(ulong)*p_Var6);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  VVar3 = bubbleJson::BubbleValue::GetType(local_20);
  pFVar1 = _stderr;
  if (VVar3 == ValueType_Array) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    VVar3 = bubbleJson::BubbleValue::GetType(local_20);
    pcVar9 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x133,5,(ulong)VVar3);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  sVar7 = bubbleJson::BubbleValue::GetArrayCount(local_20);
  pFVar1 = _stderr;
  if (sVar7 == 4) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    sVar7 = bubbleJson::BubbleValue::GetArrayCount(local_20);
    pcVar9 = "%s:%d: expect: %zu actual: %zu\n";
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x134,4,sVar7);
    g_Result = 1;
  }
  for (valueLevel2._4_4_ = 0; pBVar2 = local_20, valueLevel2._4_4_ < 4;
      valueLevel2._4_4_ = valueLevel2._4_4_ + 1) {
    pcVar9 = (char *)(long)valueLevel2._4_4_;
    pBVar8 = bubbleJson::BubbleValue::GetArrayElement(local_20,(size_t)pcVar9);
    g_TestCount = g_TestCount + 1;
    VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
    pFVar1 = _stderr;
    if (VVar3 == ValueType_Array) {
      g_TestPass = g_TestPass + 1;
    }
    else {
      VVar3 = bubbleJson::BubbleValue::GetType(pBVar8);
      pcVar9 = "%s:%d: expect: %d actual: %d\n";
      fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x138,5,(ulong)VVar3);
      g_Result = 1;
    }
    g_TestCount = g_TestCount + 1;
    sVar7 = bubbleJson::BubbleValue::GetArrayCount(pBVar8);
    pFVar1 = _stderr;
    if ((long)valueLevel2._4_4_ == sVar7) {
      g_TestPass = g_TestPass + 1;
    }
    else {
      sVar7 = bubbleJson::BubbleValue::GetArrayCount(pBVar8);
      pcVar9 = "%s:%d: expect: %zu actual: %zu\n";
      fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x139,(long)valueLevel2._4_4_,sVar7);
      g_Result = 1;
    }
    for (valueLevel3._4_4_ = 0; valueLevel3._4_4_ < valueLevel2._4_4_;
        valueLevel3._4_4_ = valueLevel3._4_4_ + 1) {
      pcVar9 = (char *)(long)valueLevel3._4_4_;
      this = bubbleJson::BubbleValue::GetArrayElement(pBVar8,(size_t)pcVar9);
      g_TestCount = g_TestCount + 1;
      VVar3 = bubbleJson::BubbleValue::GetType(this);
      pFVar1 = _stderr;
      if (VVar3 == ValueType_Number) {
        g_TestPass = g_TestPass + 1;
      }
      else {
        VVar3 = bubbleJson::BubbleValue::GetType(this);
        pcVar9 = "%s:%d: expect: %d actual: %d\n";
        fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
                0x13d,3,(ulong)VVar3);
        g_Result = 1;
      }
      g_TestCount = g_TestCount + 1;
      dVar13 = bubbleJson::BubbleValue::GetNumber(this);
      pFVar1 = _stderr;
      if (((double)valueLevel3._4_4_ != dVar13) || (NAN((double)valueLevel3._4_4_) || NAN(dVar13)))
      {
        dVar13 = bubbleJson::BubbleValue::GetNumber(this);
        pcVar9 = "%s:%d: expect: %.17g actual: %.17g\n";
        fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",(double)valueLevel3._4_4_,
                SUB84(dVar13,0),
                "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
                0x13e);
        g_Result = 1;
      }
      else {
        g_TestPass = g_TestPass + 1;
      }
    }
  }
  if (local_20 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(local_20);
    bubbleJson::BubbleValue::operator_delete(pBVar2,pcVar9);
  }
  return;
}

Assistant:

static void TestParseArray()
{
    tuple<ParseResults, BubbleValue*> result;
    BubbleValue *value;
    result = gm_BubbleJson.Parse("[ ]");
    value = get<1>(result);
    EXPECT_EQ_INT(ParseResult_Ok, get<0>(result));
    EXPECT_EQ_INT(ValueType_Array, value->GetType());
    EXPECT_EQ_SIZE_T(0, value->GetArrayCount());
    delete value;

    result = gm_BubbleJson.Parse("[ null , false , true , 123 , \"abc\" ]");
    value = get<1>(result);
    EXPECT_EQ_INT(ParseResult_Ok, get<0>(result));
    EXPECT_EQ_INT(ValueType_Array, value->GetType());
    EXPECT_EQ_SIZE_T(5, value->GetArrayCount());

    EXPECT_EQ_INT(ValueType_Null, (*value)[0].GetType());
    EXPECT_EQ_INT(ValueType_False, (*value)[1].GetType());
    EXPECT_EQ_INT(ValueType_True, (*value)[2].GetType());
    EXPECT_EQ_INT(ValueType_Number, (*value)[3].GetType());
    EXPECT_EQ_INT(ValueType_String, (*value)[4].GetType());

    EXPECT_EQ_DOUBLE(123.0, (*value)[3].GetNumber());
    EXPECT_EQ_STRING("abc", (*value)[4].GetString(), (*value)[4].GetStringLength());
    delete value;

    //a good way
    result = gm_BubbleJson.Parse("[ [ ] , [ 0 ] , [ 0 , 1 ] , [ 0 , 1 , 2 ] ]");
    value = get<1>(result);
    EXPECT_EQ_INT(ParseResult_Ok, get<0>(result));
    EXPECT_EQ_INT(ValueType_Array, value->GetType());
    EXPECT_EQ_SIZE_T(4, value->GetArrayCount());
    for (int i = 0; i < 4; ++i)
    {
        EXPECT_EQ_INT(ValueType_Array, (*value)[i].GetType());
        EXPECT_EQ_SIZE_T(i, (*value)[i].GetArrayCount());
        for (int j = 0; j < i; ++j)
        {
            EXPECT_EQ_INT(ValueType_Number, (*value)[i][j].GetType());
            EXPECT_EQ_DOUBLE((double)j, (*value)[i][j].GetNumber());
        }
    }
    delete value;

    //another way
    result = gm_BubbleJson.Parse("[ [ ] , [ 0 ] , [ 0 , 1 ] , [ 0 , 1 , 2 ] ]");
    value = get<1>(result);
    EXPECT_EQ_INT(ParseResult_Ok, get<0>(result));
    EXPECT_EQ_INT(ValueType_Array, value->GetType());
    EXPECT_EQ_SIZE_T(4, value->GetArrayCount());
    for (int i = 0; i < 4; ++i)
    {
        BubbleValue* valueLevel2 = value->GetArrayElement(i);
        EXPECT_EQ_INT(ValueType_Array, valueLevel2->GetType());
        EXPECT_EQ_SIZE_T(i, valueLevel2->GetArrayCount());
        for (int j = 0; j < i; ++j)
        {
            BubbleValue* valueLevel3 = valueLevel2->GetArrayElement(j);
            EXPECT_EQ_INT(ValueType_Number, valueLevel3->GetType());
            EXPECT_EQ_DOUBLE((double)j, valueLevel3->GetNumber());
        }
    }
    delete value;
}